

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecs.hpp
# Opt level: O1

string * __thiscall
sciplot::GridSpecs::repr_abi_cxx11_(string *__return_storage_ptr__,GridSpecs *this)

{
  pointer pGVar1;
  pointer pcVar2;
  string *psVar3;
  ostream *poVar4;
  pointer pGVar5;
  GridSpecsBase specs;
  stringstream ss;
  string local_2e8;
  string *local_2c8;
  undefined1 local_2c0 [168];
  undefined **local_218;
  _Alloc_hider local_210;
  char local_200 [16];
  undefined **local_1f0;
  bool local_1e8;
  _Alloc_hider local_1e0;
  char local_1d0 [16];
  bool local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  GridSpecsBase::repr_abi_cxx11_((string *)local_2c0,&this->super_GridSpecsBase);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_2c0._0_8_,local_2c0._8_8_);
  local_2c8 = __return_storage_ptr__;
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  pGVar5 = (this->m_gridticsspecs).
           super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->m_gridticsspecs).
           super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar5 != pGVar1) {
    do {
      local_2c0._0_8_ = &PTR__Specs_001a7058;
      LineSpecsOf<sciplot::GridSpecsBase>::LineSpecsOf
                ((LineSpecsOf<sciplot::GridSpecsBase> *)local_2c0,&PTR_PTR_001a5c20,
                 &pGVar5->super_LineSpecsOf<sciplot::GridSpecsBase>);
      local_218 = (undefined **)0x1a5d08;
      local_2c0._0_8_ =
           DepthSpecsOf<sciplot::GridSpecsBase>-in-sciplot::GridSpecsBase::construction_vtable +
           0x60;
      local_210._M_p = local_200;
      pcVar2 = (pGVar5->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar2,
                 pcVar2 + (pGVar5->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth.
                          _M_string_length);
      local_1e8 = (pGVar5->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show;
      local_2c0._0_8_ = &PTR__GridSpecsBase_001a5b80;
      local_218 = &PTR__GridSpecsBase_001a5bc0;
      local_1f0 = &PTR__GridSpecsBase_001a5c00;
      local_1e0._M_p = local_1d0;
      pcVar2 = (pGVar5->m_tics)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar2,pcVar2 + (pGVar5->m_tics)._M_string_length);
      local_1c0 = pGVar5->m_majortics;
      local_2e8._M_dataplus._M_p._0_1_ = 10;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_2e8,1);
      GridSpecsBase::repr_abi_cxx11_(&local_2e8,(GridSpecsBase *)local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(char *)CONCAT71(local_2e8._M_dataplus._M_p._1_7_,
                                         local_2e8._M_dataplus._M_p._0_1_),
                 local_2e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_) !=
          &local_2e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2e8._M_dataplus._M_p._1_7_,local_2e8._M_dataplus._M_p._0_1_),
                        local_2e8.field_2._M_allocated_capacity + 1);
      }
      GridSpecsBase::~GridSpecsBase((GridSpecsBase *)local_2c0,&GridSpecsBase::VTT);
      pGVar5 = pGVar5 + 1;
    } while (pGVar5 != pGVar1);
  }
  psVar3 = local_2c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

inline auto GridSpecs::repr() const -> std::string
{
    std::stringstream ss;
    ss << GridSpecsBase::repr();
    for (auto specs : m_gridticsspecs)
        ss << '\n'
           << specs.repr();
    return ss.str();
}